

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_valddi.cpp
# Opt level: O0

ze_result_t __thiscall
validation_layer::zesDriverGetDeviceByUuidExp
          (validation_layer *this,zes_driver_handle_t hDriver,zes_uuid_t uuid,
          zes_device_handle_t *phDevice,ze_bool_t *onSubdevice,uint32_t *subdeviceId)

{
  code *pcVar1;
  zes_uuid_t uuid_00;
  ze_result_t zVar2;
  ze_result_t result_00;
  element_type *this_00;
  size_type sVar3;
  reference ppvVar4;
  pointer pHVar5;
  size_type sStack_d8;
  ze_result_t result_2;
  size_t i_1;
  ze_result_t driver_result;
  ze_result_t result_1;
  size_type sStack_90;
  ze_result_t result;
  size_t i;
  size_type numValHandlers;
  zes_pfnDriverGetDeviceByUuidExp_t pfnGetDeviceByUuidExp;
  allocator local_61;
  string local_60 [32];
  uint32_t *local_40;
  uint32_t *subdeviceId_local;
  ze_bool_t *onSubdevice_local;
  zes_device_handle_t *phDevice_local;
  zes_driver_handle_t hDriver_local;
  zes_uuid_t uuid_local;
  
  onSubdevice_local = uuid.id._8_8_;
  uuid_local.id._0_8_ = uuid.id._0_8_;
  local_40 = (uint32_t *)onSubdevice;
  subdeviceId_local = (uint32_t *)phDevice;
  phDevice_local = (zes_device_handle_t *)this;
  unique0x10000298 = hDriver;
  this_00 = std::__shared_ptr_access<loader::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<loader::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)(context + 0xd50));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_60,
             "zesDriverGetDeviceByUuidExp(hDriver, uuid, phDevice, onSubdevice, subdeviceId)",
             &local_61);
  loader::Logger::log_trace(this_00,(string *)local_60);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  pcVar1 = *(code **)(context + 0x9f8);
  if (pcVar1 == (code *)0x0) {
    uuid_local.id._8_4_ =
         logAndPropagateResult("zesDriverGetDeviceByUuidExp",ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);
  }
  else {
    sVar3 = std::
            vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
            ::size((vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
                    *)(context + 0xd30));
    for (sStack_90 = 0; sStack_90 < sVar3; sStack_90 = sStack_90 + 1) {
      ppvVar4 = std::
                vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
                ::operator[]((vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
                              *)(context + 0xd30),sStack_90);
      zVar2 = (*(*ppvVar4)->zesValidation->_vptr_ZESValidationEntryPoints[0x112])
                        ((*ppvVar4)->zesValidation,phDevice_local,stack0xffffffffffffffe4,
                         uuid_local.id._0_8_,onSubdevice_local,subdeviceId_local,local_40);
      if (zVar2 != ZE_RESULT_SUCCESS) {
        zVar2 = logAndPropagateResult("zesDriverGetDeviceByUuidExp",zVar2);
        return zVar2;
      }
    }
    if ((*(byte *)(context + 4) & 1) != 0) {
      pHVar5 = std::
               unique_ptr<validation_layer::HandleLifetimeValidation,_std::default_delete<validation_layer::HandleLifetimeValidation>_>
               ::operator->((unique_ptr<validation_layer::HandleLifetimeValidation,_std::default_delete<validation_layer::HandleLifetimeValidation>_>
                             *)(context + 0xd48));
      uuid_00.id[8] = uuid_local.id[0];
      uuid_00.id[9] = uuid_local.id[1];
      uuid_00.id[10] = uuid_local.id[2];
      uuid_00.id[0xb] = uuid_local.id[3];
      uuid_00.id[0xc] = uuid_local.id[4];
      uuid_00.id[0xd] = uuid_local.id[5];
      uuid_00.id[0xe] = uuid_local.id[6];
      uuid_00.id[0xf] = uuid_local.id[7];
      uuid_00.id._0_8_ = stack0xffffffffffffffe4;
      zVar2 = ZESHandleLifetimeValidation::zesDriverGetDeviceByUuidExpPrologue
                        (&pHVar5->zesHandleLifetime,(zes_driver_handle_t)phDevice_local,uuid_00,
                         (zes_device_handle_t *)onSubdevice_local,(ze_bool_t *)subdeviceId_local,
                         local_40);
      if (zVar2 != ZE_RESULT_SUCCESS) {
        zVar2 = logAndPropagateResult("zesDriverGetDeviceByUuidExp",zVar2);
        return zVar2;
      }
    }
    zVar2 = (*pcVar1)(phDevice_local,stack0xffffffffffffffe4,uuid_local.id._0_8_,onSubdevice_local,
                      subdeviceId_local,local_40);
    for (sStack_d8 = 0; sStack_d8 < sVar3; sStack_d8 = sStack_d8 + 1) {
      ppvVar4 = std::
                vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
                ::operator[]((vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
                              *)(context + 0xd30),sStack_d8);
      result_00 = (*(*ppvVar4)->zesValidation->_vptr_ZESValidationEntryPoints[0x113])
                            ((*ppvVar4)->zesValidation,phDevice_local,stack0xffffffffffffffe4,
                             uuid_local.id._0_8_,onSubdevice_local,subdeviceId_local,local_40,zVar2)
      ;
      if (result_00 != ZE_RESULT_SUCCESS) {
        zVar2 = logAndPropagateResult("zesDriverGetDeviceByUuidExp",result_00);
        return zVar2;
      }
    }
    if (((zVar2 == ZE_RESULT_SUCCESS) && ((*(byte *)(context + 4) & 1) != 0)) &&
       (onSubdevice_local != (ze_bool_t *)0x0)) {
      pHVar5 = std::
               unique_ptr<validation_layer::HandleLifetimeValidation,_std::default_delete<validation_layer::HandleLifetimeValidation>_>
               ::operator->((unique_ptr<validation_layer::HandleLifetimeValidation,_std::default_delete<validation_layer::HandleLifetimeValidation>_>
                             *)(context + 0xd48));
      HandleLifetimeValidation::addHandle(pHVar5,*(ze_device_handle_t *)onSubdevice_local);
      pHVar5 = std::
               unique_ptr<validation_layer::HandleLifetimeValidation,_std::default_delete<validation_layer::HandleLifetimeValidation>_>
               ::operator->((unique_ptr<validation_layer::HandleLifetimeValidation,_std::default_delete<validation_layer::HandleLifetimeValidation>_>
                             *)(context + 0xd48));
      HandleLifetimeValidation::addDependent(pHVar5,phDevice_local,*(void **)onSubdevice_local);
    }
    uuid_local.id._8_4_ = logAndPropagateResult("zesDriverGetDeviceByUuidExp",zVar2);
  }
  zVar2._0_1_ = uuid_local.id[8];
  zVar2._1_1_ = uuid_local.id[9];
  zVar2._2_1_ = uuid_local.id[10];
  zVar2._3_1_ = uuid_local.id[0xb];
  return zVar2;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesDriverGetDeviceByUuidExp(
        zes_driver_handle_t hDriver,                    ///< [in] handle of the sysman driver instance
        zes_uuid_t uuid,                                ///< [in] universal unique identifier.
        zes_device_handle_t* phDevice,                  ///< [out] Sysman handle of the device.
        ze_bool_t* onSubdevice,                         ///< [out] True if the UUID belongs to the sub-device; false means that
                                                        ///< UUID belongs to the root device.
        uint32_t* subdeviceId                           ///< [out] If onSubdevice is true, this gives the ID of the sub-device
        )
    {
        context.logger->log_trace("zesDriverGetDeviceByUuidExp(hDriver, uuid, phDevice, onSubdevice, subdeviceId)");

        auto pfnGetDeviceByUuidExp = context.zesDdiTable.DriverExp.pfnGetDeviceByUuidExp;

        if( nullptr == pfnGetDeviceByUuidExp )
            return logAndPropagateResult("zesDriverGetDeviceByUuidExp", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zesValidation->zesDriverGetDeviceByUuidExpPrologue( hDriver, uuid, phDevice, onSubdevice, subdeviceId );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zesDriverGetDeviceByUuidExp", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zesHandleLifetime.zesDriverGetDeviceByUuidExpPrologue( hDriver, uuid, phDevice, onSubdevice, subdeviceId );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zesDriverGetDeviceByUuidExp", result);
        }

        auto driver_result = pfnGetDeviceByUuidExp( hDriver, uuid, phDevice, onSubdevice, subdeviceId );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zesValidation->zesDriverGetDeviceByUuidExpEpilogue( hDriver, uuid, phDevice, onSubdevice, subdeviceId ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zesDriverGetDeviceByUuidExp", result);
        }


        if( driver_result == ZE_RESULT_SUCCESS && context.enableHandleLifetime ){
            
            if (phDevice){
                context.handleLifetime->addHandle( *phDevice );
                context.handleLifetime->addDependent( hDriver, *phDevice );

            }
        }
        return logAndPropagateResult("zesDriverGetDeviceByUuidExp", driver_result);
    }